

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt8x16Operation::OpNotEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue negativeOnes;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  local_18 = _Var1.field_0._0_1_;
  cStack_17 = _Var1.field_0._1_1_;
  cStack_16 = _Var1.field_0._2_1_;
  cStack_15 = _Var1.field_0._3_1_;
  cStack_14 = _Var1.field_0._4_1_;
  cStack_13 = _Var1.field_0._5_1_;
  cStack_12 = _Var1.field_0._6_1_;
  cStack_11 = _Var1.field_0._7_1_;
  local_28 = _Var2.field_0._0_1_;
  cStack_27 = _Var2.field_0._1_1_;
  cStack_26 = _Var2.field_0._2_1_;
  cStack_25 = _Var2.field_0._3_1_;
  cStack_24 = _Var2.field_0._4_1_;
  cStack_23 = _Var2.field_0._5_1_;
  cStack_22 = _Var2.field_0._6_1_;
  cStack_21 = _Var2.field_0._7_1_;
  tmpaValue.field_0.i8[9] = -(cStack_17 == cStack_27);
  tmpaValue.field_0.i8[8] = -(local_18 == local_28);
  tmpaValue.field_0.i8[10] = -(cStack_16 == cStack_26);
  tmpaValue.field_0.i8[0xb] = -(cStack_15 == cStack_25);
  tmpaValue.field_0.i8[0xc] = -(cStack_14 == cStack_24);
  tmpaValue.field_0.i8[0xd] = -(cStack_13 == cStack_23);
  tmpaValue.field_0.i8[0xe] = -(cStack_12 == cStack_22);
  tmpaValue.field_0.i8[0xf] = -(cStack_11 == cStack_21);
  tmpaValue.field_0.i64[1] = ~tmpaValue.field_0.i64[1];
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpNotEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        x86Result.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a != b?

        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        x86Result.m128i_value = _mm_andnot_si128(x86Result.m128i_value, negativeOnes.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }